

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

void __thiscall
DIntermissionScreenCast::Init(DIntermissionScreenCast *this,FIntermissionAction *desc,bool first)

{
  uint uVar1;
  int iVar2;
  PClass *pPVar3;
  FICastSound *pFVar4;
  bool bVar5;
  int in_EAX;
  PClassActor *pPVar6;
  AActor *pAVar7;
  FRemapTablePtr *pFVar8;
  uint i;
  ulong uVar9;
  long lVar10;
  long lVar11;
  FSoundID local_38;
  FName local_34;
  
  local_38.ID = in_EAX;
  DIntermissionScreen::Init(&this->super_DIntermissionScreen,desc,first);
  this->mName = (char *)desc[1]._vptr_FIntermissionAction;
  _local_38 = CONCAT44(desc[1].mSize,local_38.ID);
  pPVar6 = PClass::FindActor(&local_34);
  this->mClass = pPVar6;
  if (pPVar6 == (PClassActor *)0x0) {
    this->mDefaults = (AActor *)0x0;
    this->caststate = (FState *)0x0;
    return;
  }
  this->mDefaults = (AActor *)(pPVar6->super_PClass).Defaults;
  TArray<FICastSound,_FICastSound>::Resize
            (&this->mCastSounds,*(uint *)((long)&desc[1].mMusic.Chars + 4));
  lVar10 = 8;
  lVar11 = 4;
  for (uVar9 = 0; uVar9 < (this->mCastSounds).Count; uVar9 = uVar9 + 1) {
    pPVar3 = desc[1].mClass;
    pFVar4 = (this->mCastSounds).Array;
    *(undefined1 *)((long)pFVar4 + lVar11 + -4) = *(undefined1 *)((long)pPVar3 + lVar10 + -8);
    *(undefined1 *)((long)pFVar4 + lVar11 + -3) = *(undefined1 *)((long)pPVar3 + lVar10 + -7);
    FSoundID::operator=((FSoundID *)(&pFVar4->mSequence + lVar11),
                        (FString *)
                        ((long)&(pPVar3->super_PNativeStruct).super_PStruct.super_PNamedType.
                                super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                        lVar10));
    lVar10 = lVar10 + 0x10;
    lVar11 = lVar11 + 8;
  }
  this->caststate = this->mDefaults->SeeState;
  bVar5 = PClass::IsAncestorOf(APlayerPawn::RegistrationInfo.MyClass,&this->mClass->super_PClass);
  if (bVar5) {
    pAVar7 = this->mDefaults;
    this->advplayerstate = pAVar7->MissileState;
    uVar9 = (ulong)consoleplayer;
    pFVar8 = translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array;
  }
  else {
    this->advplayerstate = (FState *)0x0;
    this->casttranslation = (FRemapTable *)0x0;
    pAVar7 = this->mDefaults;
    uVar1 = pAVar7->Translation;
    if (uVar1 == 0) goto LAB_00326c29;
    uVar9 = (ulong)(ushort)uVar1;
    pFVar8 = *(FRemapTablePtr **)
              ((long)&translationtables[0].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array +
              (ulong)(uVar1 >> 0xc & 0xff0));
  }
  this->casttranslation = pFVar8[uVar9].Ptr;
LAB_00326c29:
  this->castdeath = false;
  this->castattacking = false;
  this->castframes = 0;
  this->castonmelee = 0;
  iVar2 = (pAVar7->SeeSound).super_FSoundID.ID;
  if (iVar2 != 0) {
    _local_38 = CONCAT44(local_34.Index,iVar2);
    S_Sound(0x22,&local_38,1.0,0.0);
  }
  return;
}

Assistant:

void DIntermissionScreenCast::Init(FIntermissionAction *desc, bool first)
{
	Super::Init(desc, first);
	mName = static_cast<FIntermissionActionCast*>(desc)->mName;
	mClass = PClass::FindActor(static_cast<FIntermissionActionCast*>(desc)->mCastClass);
	if (mClass != NULL) mDefaults = GetDefaultByType(mClass);
	else
	{
		mDefaults = NULL;
		caststate = NULL;
		return;
	}

	mCastSounds.Resize(static_cast<FIntermissionActionCast*>(desc)->mCastSounds.Size());
	for (unsigned i=0; i < mCastSounds.Size(); i++)
	{
		mCastSounds[i].mSequence = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mSequence;
		mCastSounds[i].mIndex = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mIndex;
		mCastSounds[i].mSound = static_cast<FIntermissionActionCast*>(desc)->mCastSounds[i].mSound;
	}
	caststate = mDefaults->SeeState;
	if (mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
	{
		advplayerstate = mDefaults->MissileState;
		casttranslation = translationtables[TRANSLATION_Players][consoleplayer];
	}
	else
	{
		advplayerstate = NULL;
		casttranslation = NULL;
		if (mDefaults->Translation != 0)
		{
			casttranslation = translationtables[GetTranslationType(mDefaults->Translation)]
												[GetTranslationIndex(mDefaults->Translation)];
		}
	}
	castdeath = false;
	castframes = 0;
	castonmelee = 0;
	castattacking = false;
	if (mDefaults->SeeSound)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, mDefaults->SeeSound, 1, ATTN_NONE);
	}
}